

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_rule.hpp
# Opt level: O0

error_code __thiscall
pstore::exchange::import_ns::rule::
push<pstore::exchange::import_ns::internal_fixup,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,pstore::gsl::not_null<std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>*>>
          (rule *this,not_null<const_pstore::exchange::import_ns::string_mapping_*> args,
          not_null<std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>_*>
          args_1)

{
  context *pcVar1;
  error_code eVar2;
  unique_ptr<pstore::exchange::import_ns::internal_fixup,_std::default_delete<pstore::exchange::import_ns::internal_fixup>_>
  local_40;
  unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
  local_38;
  rule *local_30;
  rule *this_local;
  not_null<std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>_*>
  args_local_1;
  not_null<const_pstore::exchange::import_ns::string_mapping_*> args_local;
  error_category *local_10;
  
  local_30 = this;
  this_local = (rule *)args_1.ptr_;
  args_local_1.ptr_ =
       (vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_> *)
       args.ptr_;
  pcVar1 = gsl::not_null<pstore::exchange::import_ns::context_*>::operator->(&this->context_);
  std::
  make_unique<pstore::exchange::import_ns::internal_fixup,pstore::gsl::not_null<pstore::exchange::import_ns::context*>const&,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>&,pstore::gsl::not_null<std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>*>&>
            ((not_null<pstore::exchange::import_ns::context_*> *)&local_40,
             (not_null<const_pstore::exchange::import_ns::string_mapping_*> *)&this->context_,
             &args_local_1);
  std::
  unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>
  ::
  unique_ptr<pstore::exchange::import_ns::internal_fixup,std::default_delete<pstore::exchange::import_ns::internal_fixup>,void>
            ((unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>
              *)&local_38,&local_40);
  std::
  stack<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::deque<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>_>
  ::push(&pcVar1->stack,(value_type *)&local_38);
  std::
  unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
  ::~unique_ptr(&local_38);
  std::
  unique_ptr<pstore::exchange::import_ns::internal_fixup,_std::default_delete<pstore::exchange::import_ns::internal_fixup>_>
  ::~unique_ptr(&local_40);
  log_top(this,true);
  std::error_code::error_code((error_code *)&args_local);
  eVar2._4_4_ = 0;
  eVar2._M_value = (uint)args_local.ptr_;
  eVar2._M_cat = local_10;
  return eVar2;
}

Assistant:

std::error_code push (Args... args) {
                    context_->stack.push (std::make_unique<T> (context_, args...));
                    this->log_top (true);
                    return {};
                }